

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::BroadcastToStaticLayerParams::_InternalSerialize
          (BroadcastToStaticLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  bool bVar2;
  uint8_t *puVar3;
  LogMessage *other;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong *puVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar8 = (this->_targetshape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *puVar3 = '\n';
    target = puVar3 + 2;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    puVar9 = (ulong *)(this->targetshape_).arena_or_elements_;
    puVar1 = puVar9 + (this->targetshape_).current_size_;
    do {
      pbVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar6 = *puVar9;
      *pbVar4 = (byte)uVar6;
      if (uVar6 < 0x80) {
        target = pbVar4 + 1;
      }
      else {
        *pbVar4 = (byte)uVar6 | 0x80;
        pbVar4[1] = (byte)(uVar6 >> 7);
        target = pbVar4 + 2;
        if (0x3fff < uVar6) {
          uVar7 = (ulong)pbVar4[1];
          uVar6 = uVar6 >> 7;
          do {
            target[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar6 >> 7;
            *target = (byte)uVar5;
            target = target + 1;
            uVar7 = uVar5 & 0xffffffff;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar5;
          } while (bVar2);
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* BroadcastToStaticLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BroadcastToStaticLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 targetShape = 1;
  {
    int byte_size = _targetshape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          1, _internal_targetshape(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BroadcastToStaticLayerParams)
  return target;
}